

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

void crnlib::LzmaEnc_InitPriceTables(UInt32 *ProbPrices)

{
  int local_24;
  int local_20;
  int j;
  UInt32 bitCount;
  UInt32 w;
  int kCyclesBits;
  UInt32 i;
  UInt32 *ProbPrices_local;
  
  for (w = 8; w < 0x800; w = w + 0x10) {
    j = w;
    local_20 = 0;
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      local_20 = local_20 << 1;
      for (j = j * j; 0xffff < (uint)j; j = (uint)j >> 1) {
        local_20 = local_20 + 1;
      }
    }
    ProbPrices[w >> 4] = 0xa1 - local_20;
  }
  return;
}

Assistant:

void LzmaEnc_InitPriceTables(UInt32* ProbPrices) {
  UInt32 i;
  for (i = (1 << kNumMoveReducingBits) / 2; i < kBitModelTotal; i += (1 << kNumMoveReducingBits)) {
    const int kCyclesBits = kNumBitPriceShiftBits;
    UInt32 w = i;
    UInt32 bitCount = 0;
    int j;
    for (j = 0; j < kCyclesBits; j++) {
      w = w * w;
      bitCount <<= 1;
      while (w >= ((UInt32)1 << 16)) {
        w >>= 1;
        bitCount++;
      }
    }
    ProbPrices[i >> kNumMoveReducingBits] = ((kNumBitModelTotalBits << kCyclesBits) - 15 - bitCount);
  }
}